

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_reference_unittest.cpp
# Opt level: O0

void __thiscall
ArrayReference_from_std_vector_Test::TestBody(ArrayReference_from_std_vector_Test *this)

{
  initializer_list<int> __l;
  bool bVar1;
  reference expected;
  char *message;
  AssertHelper local_e0;
  Message local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar;
  size_type sStack_b8;
  int i;
  size_type local_b0;
  array_reference_type local_a8;
  undefined1 local_90 [8];
  by_value v1;
  allocator<int> local_59;
  int local_58 [8];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  stdvec svec;
  ArrayReference_from_std_vector_Test *this_local;
  
  local_58[0] = 5;
  local_58[1] = 6;
  local_58[2] = 7;
  local_58[3] = 8;
  local_58[4] = 9;
  local_38 = local_58;
  local_30 = 5;
  svec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  std::allocator<int>::allocator(&local_59);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,__l,&local_59);
  std::allocator<int>::~allocator(&local_59);
  memory::
  Array<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>::
  Array<int,int,void,void>
            ((Array<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
              *)local_90,10,0);
  local_b0 = 5;
  sStack_b8 = 10;
  memory::
  ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::operator()(&local_a8,
               (ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
                *)local_90,&local_b0,&stack0xffffffffffffff48);
  memory::
  ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
  ::operator=((ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
               *)&local_a8,(vector<int,_std::allocator<int>_> *)local_28);
  memory::
  ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~ArrayReference(&local_a8);
  for (gtest_ar.message_.ptr_._4_4_ = 5; gtest_ar.message_.ptr_._4_4_ < 10;
      gtest_ar.message_.ptr_._4_4_ = gtest_ar.message_.ptr_._4_4_ + 1) {
    expected = memory::
               ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
               ::operator[]((ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
                             *)local_90,(long)gtest_ar.message_.ptr_._4_4_);
    testing::internal::EqHelper<false>::Compare<int,int>
              ((EqHelper<false> *)local_d0,"v1[i]","i",expected,
               (int *)((long)&gtest_ar.message_.ptr_ + 4));
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
    if (!bVar1) {
      testing::Message::Message(&local_d8);
      message = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_reference_unittest.cpp"
                 ,0x3b,message);
      testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      testing::Message::~Message(&local_d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  }
  memory::
  Array<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~Array((Array<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
            *)local_90);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return;
}

Assistant:

TEST(ArrayReference, from_std_vector) {
    using namespace memory;

    using by_value = Array<int, HostCoordinator<int>>;

    using stdvec = std::vector<int>;

    stdvec svec = {5,6,7,8,9};

    // create range by value of length 10
    by_value v1(10, 0);

    v1(5, 10) = svec;

    for(auto i=5; i<10; ++i)
        EXPECT_EQ(v1[i], i);
}